

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cabal.c
# Opt level: O0

void spell_bane(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  ulong uVar1;
  long in_RCX;
  __type_conflict2 _Var2;
  int damage;
  CHAR_DATA *victim;
  undefined1 in_stack_00001322;
  undefined1 in_stack_00001323;
  int in_stack_00001324;
  int in_stack_00001328;
  int in_stack_0000132c;
  CHAR_DATA *in_stack_00001330;
  CHAR_DATA *in_stack_00001338;
  int in_stack_00001358;
  int in_stack_00001360;
  char *in_stack_00001368;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  
  uVar1 = *(ulong *)(in_RCX + 0x180);
  _Var2 = std::pow<int,int>(0,0x652f35);
  if ((uVar1 & (long)_Var2) == 0) {
    dice(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  }
  else {
    dice(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    act(in_stack_ffffffffffffffc0,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
        (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
        (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    act(in_stack_ffffffffffffffc0,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
        (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
        (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    act(in_stack_ffffffffffffffc0,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
        (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
        (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
  }
  damage_new(in_stack_00001338,in_stack_00001330,in_stack_0000132c,in_stack_00001328,
             in_stack_00001324,(bool)in_stack_00001323,(bool)in_stack_00001322,in_stack_00001358,
             in_stack_00001360,in_stack_00001368);
  return;
}

Assistant:

void spell_bane(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int damage;

	if (IS_SET(victim->act, PLR_IGNORANT))
	{
		damage = 3 * dice(level, 3);
		act("Your mental assault tears at $N's ignorance!", ch, 0, victim, TO_CHAR);
		act("$n's mental assault tears at your ignorance!", ch, 0, victim, TO_VICT);
		act("$n's mental assault tears at $N's ignorance!", ch, 0, victim, TO_NOTVICT);
	}
	else
	{
		damage = 2 * dice(level, 2);
	}

	damage_new(ch, victim, damage, gsn_bane, DAM_MENTAL, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "mental assault");
}